

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1HighbdUpsampledPredTest_CheckOutput_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::AV1HighbdUpsampledPredTest_CheckOutput_Test>
           *this)

{
  AV1HighbdUpsampledPredTest *this_00;
  
  WithParamInterface<std::tuple<void(*)(macroblockd*,AV1Common_const*,int,int,mv_const*,unsigned_char*,int,int,int,int,unsigned_char_const*,int,int,int),BLOCK_SIZE,int>>
  ::parameter_ = &this->parameter_;
  this_00 = (AV1HighbdUpsampledPredTest *)operator_new(0x48);
  anon_unknown.dwarf_180f112::AV1HighbdUpsampledPredTest::AV1HighbdUpsampledPredTest(this_00);
  (this_00->super_AV1HighbdCompMaskPredTestBase).super_Test._vptr_Test =
       (_func_int **)&PTR__AV1HighbdUpsampledPredTest_00f49cd8;
  (this_00->
  super_WithParamInterface<std::tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int,_int),_BLOCK_SIZE,_int>_>
  )._vptr_WithParamInterface = (_func_int **)&DAT_00f49d18;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }